

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plan_cte_node.cpp
# Opt level: O2

unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true> __thiscall
duckdb::Binder::CreatePlan
          (Binder *this,BoundCTENode *node,
          unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
          *base)

{
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true> *this_00;
  shared_ptr<duckdb::Binder,_true> *this_01;
  LogicalOperator *pLVar1;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var2;
  undefined8 uVar3;
  pointer pBVar4;
  BoundCTENode *base_00;
  Binder *pBVar5;
  mapped_type *pmVar6;
  type puVar7;
  pointer pLVar8;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> *this_02;
  undefined8 *in_RCX;
  undefined1 uVar9;
  BoundQueryNode *node_00;
  BoundQueryNode *__k;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> _Var10;
  _Head_base<0UL,_duckdb::LogicalOperator_*,_false> local_60;
  undefined1 local_58 [24];
  element_type *local_40;
  ClientContext *local_38;
  
  unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::operator*
            ((unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
              *)(base + 0xf));
  CreatePlan((Binder *)(local_58 + 0x10),&node->super_BoundQueryNode);
  local_60._M_head_impl = (LogicalOperator *)0x0;
  if (base[0x10].
      super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
      super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>.
      _M_t.
      super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
      .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl ==
      (LogicalOperator *)0x0) {
    _Var10._M_head_impl = (LogicalOperator *)(element_type *)0x0;
LAB_00a5f951:
    local_60._M_head_impl = (LogicalOperator *)*in_RCX;
    *in_RCX = 0;
  }
  else {
    this_00 = (unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
               *)(base + 0x10);
    pBVar4 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
             operator->(this_00);
    if (pBVar4->type == CTE_NODE) {
      pBVar4 = unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>
               ::operator->(this_00);
      base_00 = BoundQueryNode::Cast<duckdb::BoundCTENode>(pBVar4);
      local_40 = (element_type *)*in_RCX;
      *in_RCX = 0;
      CreatePlan((Binder *)local_58,node,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)base_00);
      _Var2._M_head_impl = local_60._M_head_impl;
      local_60._M_head_impl = (LogicalOperator *)local_58._0_8_;
      _Var10._M_head_impl = (LogicalOperator *)local_40;
      if ((element_type *)_Var2._M_head_impl != (element_type *)0x0) {
        (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                     &(_Var2._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                    super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
        _Var10._M_head_impl = (LogicalOperator *)local_40;
      }
    }
    else {
      _Var10._M_head_impl = local_60._M_head_impl;
      if ((this_00->
          super_unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>).
          _M_t.
          super___uniq_ptr_impl<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>_>
          ._M_t.
          super__Tuple_impl<0UL,_duckdb::BoundQueryNode_*,_std::default_delete<duckdb::BoundQueryNode>_>
          .super__Head_base<0UL,_duckdb::BoundQueryNode_*,_false>._M_head_impl ==
          (BoundQueryNode *)0x0) goto LAB_00a5f951;
      unique_ptr<duckdb::BoundQueryNode,_std::default_delete<duckdb::BoundQueryNode>,_true>::
      operator*(this_00);
      CreatePlan((Binder *)local_58,&node->super_BoundQueryNode);
      uVar3 = local_58._0_8_;
      _Var10._M_head_impl = local_60._M_head_impl;
      local_58._0_8_ = (element_type *)0x0;
      local_60._M_head_impl = (LogicalOperator *)uVar3;
      if ((element_type *)_Var10._M_head_impl == (element_type *)0x0) goto LAB_00a5f96a;
      (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)
                   &(_Var10._M_head_impl)->_vptr_LogicalOperator)->__weak_this_).internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
      _Var10._M_head_impl = (LogicalOperator *)local_58._0_8_;
    }
  }
  if ((element_type *)_Var10._M_head_impl != (element_type *)0x0) {
    (*(code *)(((((element_type *)_Var10._M_head_impl)->
                super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
  }
LAB_00a5f96a:
  this_01 = (shared_ptr<duckdb::Binder,_true> *)(base + 0x14);
  pBVar5 = shared_ptr<duckdb::Binder,_true>::operator->(this_01);
  __k = (BoundQueryNode *)(base + 0xb);
  node_00 = __k;
  pmVar6 = ::std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)&pBVar5->bind_context,(key_type *)__k);
  if ((pmVar6->internal).super___shared_ptr<unsigned_long,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    pBVar5 = shared_ptr<duckdb::Binder,_true>::operator->(this_01);
    node_00 = __k;
    pmVar6 = ::std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::shared_ptr<unsigned_long,_true>_>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pBVar5->bind_context,(key_type *)__k);
    puVar7 = shared_ptr<unsigned_long,_true>::operator*(pmVar6);
    if (*puVar7 != 0) {
      this_02 = &local_60;
      while ((pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                                     *)this_02),
             (long)(pLVar8->children).
                   super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(pLVar8->children).
                   super_vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                   .
                   super__Vector_base<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>_>_>
                   ._M_impl.super__Vector_impl_data._M_start == 8 &&
             (pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                       ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                                     *)this_02), pLVar8->type != LOGICAL_CTE_REF))) {
        pLVar8 = unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                 ::operator->((unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                               *)this_02);
        this_02 = (_Head_base<0UL,_duckdb::LogicalOperator_*,_false> *)
                  vector<duckdb::unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>,_true>
                  ::get<true>(&pLVar8->children,0);
      }
      local_38 = (ClientContext *)
                 (((long)base[9].
                         super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                         ._M_t.
                         super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                         .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl -
                  (long)base[8].
                        super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                        ._M_t.
                        super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>
                        .super__Head_base<0UL,_duckdb::LogicalOperator_*,_false>._M_head_impl) /
                 0x18);
      make_uniq<duckdb::LogicalMaterializedCTE,std::__cxx11::string&,unsigned_long&,unsigned_long,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>,duckdb::unique_ptr<duckdb::LogicalOperator,std::default_delete<duckdb::LogicalOperator>,true>>
                ((duckdb *)local_58,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__k,
                 (unsigned_long *)(base + 0x11),(unsigned_long *)&local_38,
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)(local_58 + 0x10),
                 (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>,_true>
                  *)this_02);
      uVar3 = local_58._0_8_;
      local_58._0_8_ = (element_type *)0x0;
      pLVar1 = this_02->_M_head_impl;
      this_02->_M_head_impl = (LogicalOperator *)uVar3;
      node_00 = __k;
      if ((pLVar1 != (LogicalOperator *)0x0) &&
         ((*pLVar1->_vptr_LogicalOperator[1])(), node_00 = __k,
         (element_type *)local_58._0_8_ != (element_type *)0x0)) {
        (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_58._0_8_)->__weak_this_).
                    internal.super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
                  super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
        node_00 = __k;
      }
      uVar9 = 1;
      if ((*(char *)&node[3].super_BoundQueryNode.modifiers.
                     super_vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
                     .
                     super__Vector_base<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
                     ._M_impl.super__Vector_impl_data._M_start == '\0') &&
         (pBVar5 = shared_ptr<duckdb::Binder,_true>::operator->(this_01),
         pBVar5->has_unplanned_dependent_joins == false)) {
        pBVar5 = shared_ptr<duckdb::Binder,_true>::operator->
                           ((shared_ptr<duckdb::Binder,_true> *)(base + 0x12));
        uVar9 = pBVar5->has_unplanned_dependent_joins;
      }
      *(undefined1 *)
       &node[3].super_BoundQueryNode.modifiers.
        super_vector<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
        .
        super__Vector_base<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::BoundResultModifier,_std::default_delete<duckdb::BoundResultModifier>,_true>_>_>
        ._M_impl.super__Vector_impl_data._M_start = uVar9;
    }
  }
  local_58._8_8_ = local_60._M_head_impl;
  local_60._M_head_impl = (LogicalOperator *)0x0;
  VisitQueryNode(this,node_00,base);
  if ((element_type *)local_58._8_8_ != (element_type *)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::Binder> *)local_58._8_8_)->__weak_this_).internal
                .super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_enable_shared_from_this<duckdb::Binder>).__weak_this_.internal.
              super___weak_ptr<duckdb::Binder,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)();
  }
  local_58._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  if (local_60._M_head_impl != (LogicalOperator *)0x0) {
    (*(local_60._M_head_impl)->_vptr_LogicalOperator[1])();
  }
  if ((ClientContext *)local_58._16_8_ != (ClientContext *)0x0) {
    (*(code *)(((((enable_shared_from_this<duckdb::ClientContext> *)local_58._16_8_)->__weak_this_).
                internal.super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
              ->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi)
              ();
  }
  return (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)
         (unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>)this;
}

Assistant:

unique_ptr<LogicalOperator> Binder::CreatePlan(BoundCTENode &node, unique_ptr<LogicalOperator> base) {
	// Generate the logical plan for the cte_query and child.
	auto cte_query = CreatePlan(*node.query);
	unique_ptr<LogicalOperator> root;
	if (node.child && node.child->type == QueryNodeType::CTE_NODE) {
		root = CreatePlan(node.child->Cast<BoundCTENode>(), std::move(base));
	} else if (node.child) {
		root = CreatePlan(*node.child);
	} else {
		root = std::move(base);
	}

	// Only keep the materialized CTE, if it is used
	if (node.child_binder->bind_context.cte_references[node.ctename] &&
	    *node.child_binder->bind_context.cte_references[node.ctename] > 0) {

		// Push the CTE through single-child operators so query modifiers appear ABOVE the CTE (internal issue #2652)
		// Otherwise, we may have a LIMIT on top of the CTE, and an ORDER BY in the query, and we can't make a TopN
		reference<unique_ptr<LogicalOperator>> cte_child = root;
		while (cte_child.get()->children.size() == 1 && cte_child.get()->type != LogicalOperatorType::LOGICAL_CTE_REF) {
			cte_child = cte_child.get()->children[0];
		}
		cte_child.get() = make_uniq<LogicalMaterializedCTE>(node.ctename, node.setop_index, node.types.size(),
		                                                    std::move(cte_query), std::move(cte_child.get()));

		// check if there are any unplanned subqueries left in either child
		has_unplanned_dependent_joins = has_unplanned_dependent_joins ||
		                                node.child_binder->has_unplanned_dependent_joins ||
		                                node.query_binder->has_unplanned_dependent_joins;
	}
	return VisitQueryNode(node, std::move(root));
}